

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

bool __thiscall ExecutorX86::AddBreakpoint(ExecutorX86 *this,uint instruction,bool oneHit)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar **ppuVar4;
  bool bVar5;
  Breakpoint local_28;
  byte local_1d;
  uint local_1c;
  bool oneHit_local;
  ExecutorX86 *pEStack_18;
  uint instruction_local;
  ExecutorX86 *this_local;
  
  local_1d = oneHit;
  local_1c = instruction;
  pEStack_18 = this;
  uVar1 = FastVector<unsigned_char_*,_false,_false>::size(&this->instAddress);
  if (uVar1 < instruction) {
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
    this->execErrorMessage = this->execErrorBuffer;
    this_local._7_1_ = false;
  }
  else {
    while( true ) {
      uVar1 = local_1c;
      uVar2 = FastVector<unsigned_char_*,_false,_false>::size(&this->instAddress);
      bVar5 = false;
      if (uVar1 < uVar2) {
        ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->instAddress,local_1c)
        ;
        bVar5 = *ppuVar4 == (uchar *)0x0;
      }
      uVar1 = local_1c;
      if (!bVar5) break;
      local_1c = local_1c + 1;
    }
    uVar3 = FastVector<unsigned_char_*,_false,_false>::size(&this->instAddress);
    uVar2 = local_1c;
    if (uVar1 < uVar3) {
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->instAddress,local_1c);
      Breakpoint::Breakpoint(&local_28,uVar2,**ppuVar4,(bool)(local_1d & 1));
      FastVector<ExecutorX86::Breakpoint,_false,_false>::push_back
                (&this->breakInstructions,&local_28);
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->instAddress,local_1c);
      **ppuVar4 = 0xcc;
      this_local._7_1_ = true;
    }
    else {
      NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
      this->execErrorMessage = this->execErrorBuffer;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutorX86::AddBreakpoint(unsigned int instruction, bool oneHit)
{
	if(instruction > instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	while(instruction < instAddress.size() && !instAddress[instruction])
		instruction++;

	if(instruction >= instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	breakInstructions.push_back(Breakpoint(instruction, *instAddress[instruction], oneHit));
	*instAddress[instruction] = 0xcc;
	return true;
}